

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O1

int X509_VERIFY_PARAM_set1_ip_asc(X509_VERIFY_PARAM *param,char *ipasc)

{
  int iVar1;
  uchar ipout [16];
  uint8_t auStack_18 [16];
  
  iVar1 = x509v3_a2i_ipadd(auStack_18,ipasc);
  if (iVar1 != 0) {
    if (((iVar1 == 0x10) || (iVar1 == 4)) &&
       (iVar1 = int_x509_param_set1((char **)&param->ip,&param->iplen,(char *)auStack_18,(long)iVar1
                                   ), iVar1 != 0)) {
      return 1;
    }
    param->poison = '\x01';
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int X509_VERIFY_PARAM_set1_ip_asc(X509_VERIFY_PARAM *param, const char *ipasc) {
  unsigned char ipout[16];
  size_t iplen;

  iplen = (size_t)x509v3_a2i_ipadd(ipout, ipasc);
  if (iplen == 0) {
    return 0;
  }
  return X509_VERIFY_PARAM_set1_ip(param, ipout, iplen);
}